

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptual_linear_predictive_coefficients_analysis.h
# Opt level: O1

void __thiscall
sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
~PerceptualLinearPredictiveCoefficientsAnalysis
          (PerceptualLinearPredictiveCoefficientsAnalysis *this)

{
  pointer pdVar1;
  FourierTransformInterface *pFVar2;
  
  this->_vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
       (_func_int **)&PTR__PerceptualLinearPredictiveCoefficientsAnalysis_00119628;
  pdVar1 = (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  (this->inverse_fourier_transform_)._vptr_InverseFourierTransform =
       (_func_int **)&PTR__InverseFourierTransform_00119658;
  pFVar2 = (this->inverse_fourier_transform_).inverse_fourier_transform_;
  if (pFVar2 != (FourierTransformInterface *)0x0) {
    (*pFVar2->_vptr_FourierTransformInterface[1])();
  }
  MelFilterBankAnalysis::~MelFilterBankAnalysis(&this->mel_filter_bank_analysis_);
  return;
}

Assistant:

virtual ~PerceptualLinearPredictiveCoefficientsAnalysis() {
  }